

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O2

bool __thiscall ON_UserData::IsValid(ON_UserData *this,ON_TextLog *text_log)

{
  int iVar1;
  undefined4 extraout_var;
  char *format;
  ON_UUID local_40;
  ON_UUID local_30;
  
  iVar1 = ON_UuidCompare(&this->m_userdata_uuid,&ON_nil_uuid);
  if (iVar1 == 0) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "invalid userdata - m_userdata_uuid = nil\n";
  }
  else {
    local_40 = ON_ClassId::Uuid(&m_ON_UserData_class_rtti);
    iVar1 = ON_UuidCompare(&this->m_userdata_uuid,&local_40);
    if (iVar1 == 0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = "invalid userdata - m_userdata_uuid in use. Use guidgen to get a unique id.\n";
    }
    else {
      iVar1 = (*(this->super_ON_Object)._vptr_ON_Object[0x19])(this);
      if ((char)iVar1 == '\0') {
        return true;
      }
      iVar1 = (**(this->super_ON_Object)._vptr_ON_Object)(this);
      local_40 = ON_ClassId::Uuid((ON_ClassId *)CONCAT44(extraout_var,iVar1));
      local_30 = ON_ClassId::Uuid(&m_ON_UserData_class_rtti);
      iVar1 = ON_UuidCompare(&local_40,&local_30);
      if (iVar1 != 0) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      format = 
      "invalid userdata - classes derived from ON_UserData that get saved in 3dm archives must have a class id and name defined by ON_OBJECT_DECLARE/ON_OBJECT_IMPLEMENT.\n"
      ;
    }
  }
  ON_TextLog::Print(text_log,format);
  return false;
}

Assistant:

bool ON_UserData::IsValid( ON_TextLog* text_log ) const
{
  if ( 0 == ON_UuidCompare( &m_userdata_uuid, &ON_nil_uuid ) )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid userdata - m_userdata_uuid = nil\n");
    }
    return false;
  }

  if ( 0 == ON_UuidCompare( m_userdata_uuid, ON_UserData::ClassId()->Uuid() ) )
  {
    if ( 0 != text_log )
    {
      text_log->Print("invalid userdata - m_userdata_uuid in use. Use guidgen to get a unique id.\n");
    }
    return false;
  }

  if ( Archive() && 0 == ON_UuidCompare( ClassId()->Uuid(), ON_UserData::ClassId()->Uuid() ) )
  {
    // 8 January 2004 Dale Lear:
    //  I added this test to help developers remember to use
    //  the ON_DECLARE_OBJECT/ON_IMPLEMENT_OBJECT macros when
    //  they create user data that gets archived.
    if ( 0 != text_log )
    {
      text_log->Print("invalid userdata - classes derived from ON_UserData that get saved in 3dm archives must have a class id and name defined by ON_OBJECT_DECLARE/ON_OBJECT_IMPLEMENT.\n");
    }
    return false;
  }

  return true;
}